

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  Geometry *pGVar15;
  RTCFilterFunctionN p_Var16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined4 uVar48;
  int iVar49;
  long lVar50;
  byte bVar51;
  undefined1 (*pauVar52) [16];
  undefined1 (*pauVar53) [16];
  long lVar54;
  ulong uVar55;
  long lVar56;
  undefined1 (*pauVar57) [16];
  uint uVar58;
  uint uVar59;
  ulong uVar60;
  ulong uVar61;
  long lVar62;
  long lVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 extraout_var [56];
  float fVar76;
  undefined1 auVar77 [16];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar86;
  float fVar96;
  undefined1 auVar87 [16];
  float fVar94;
  float fVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  __m128 a;
  undefined1 auVar100 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar101 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [64];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  uint uVar116;
  uint uVar117;
  uint uVar118;
  uint uVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  RTCFilterFunctionNArguments args;
  vint8 bi;
  vbool<8> valid;
  vfloat<8> tNear;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_2898) [16];
  ulong local_2890;
  undefined8 local_2870;
  undefined8 local_2850;
  undefined8 uStack_2848;
  undefined8 *local_2840;
  ulong local_2838;
  ulong local_2830;
  ulong local_2828;
  ulong local_2820;
  ulong local_2818;
  ulong local_2810;
  ulong local_2808;
  long local_2800;
  ulong local_27f8;
  ulong local_27f0;
  ulong local_27e8;
  ulong local_27e0;
  ulong local_27d8;
  ulong local_27d0;
  long local_27c8;
  long local_27c0;
  ulong local_27b8;
  RTCFilterFunctionNArguments local_27b0;
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  int local_2700;
  int iStack_26fc;
  int iStack_26f8;
  int iStack_26f4;
  int iStack_26f0;
  int iStack_26ec;
  int iStack_26e8;
  int iStack_26e4;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [8];
  float fStack_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  float fStack_26a4;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2620 [32];
  float local_2600 [4];
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  float local_25e0 [4];
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  int local_2500;
  int iStack_24fc;
  int iStack_24f8;
  int iStack_24f4;
  int iStack_24f0;
  int iStack_24ec;
  int iStack_24e8;
  int iStack_24e4;
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  RTCHitN local_24b0 [16];
  undefined1 local_24a0 [16];
  undefined1 local_2490 [16];
  undefined1 local_2480 [16];
  float local_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined1 local_2450 [16];
  uint local_2440;
  uint uStack_243c;
  uint uStack_2438;
  uint uStack_2434;
  uint uStack_2430;
  uint uStack_242c;
  uint uStack_2428;
  uint uStack_2424;
  undefined1 local_2420 [8];
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar129 [32];
  
  local_2898 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar76 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_2720._4_4_ = fVar76;
  local_2720._0_4_ = fVar76;
  local_2720._8_4_ = fVar76;
  local_2720._12_4_ = fVar76;
  local_2720._16_4_ = fVar76;
  local_2720._20_4_ = fVar76;
  local_2720._24_4_ = fVar76;
  local_2720._28_4_ = fVar76;
  auVar108 = ZEXT3264(local_2720);
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2740._4_4_ = fVar86;
  local_2740._0_4_ = fVar86;
  local_2740._8_4_ = fVar86;
  local_2740._12_4_ = fVar86;
  local_2740._16_4_ = fVar86;
  local_2740._20_4_ = fVar86;
  local_2740._24_4_ = fVar86;
  local_2740._28_4_ = fVar86;
  auVar109 = ZEXT3264(local_2740);
  fVar94 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2760._4_4_ = fVar94;
  local_2760._0_4_ = fVar94;
  local_2760._8_4_ = fVar94;
  local_2760._12_4_ = fVar94;
  local_2760._16_4_ = fVar94;
  local_2760._20_4_ = fVar94;
  local_2760._24_4_ = fVar94;
  local_2760._28_4_ = fVar94;
  auVar111 = ZEXT3264(local_2760);
  fVar76 = fVar76 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar86 = fVar86 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar94 = fVar94 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_27d0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_27d8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_27e0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_27e8 = local_27d0 ^ 0x20;
  local_27f0 = local_27d8 ^ 0x20;
  local_27f8 = local_27e0 ^ 0x20;
  iStack_26e4 = (tray->tfar).field_0.i[k];
  local_23e0._8_4_ = 0x80000000;
  local_23e0._0_8_ = 0x8000000080000000;
  local_23e0._12_4_ = 0x80000000;
  local_23e0._16_4_ = 0x80000000;
  local_23e0._20_4_ = 0x80000000;
  local_23e0._24_4_ = 0x80000000;
  local_23e0._28_4_ = 0x80000000;
  local_2780._0_8_ = CONCAT44(fVar76,fVar76) ^ 0x8000000080000000;
  local_2780._8_4_ = -fVar76;
  local_2780._12_4_ = -fVar76;
  local_2780._16_4_ = -fVar76;
  local_2780._20_4_ = -fVar76;
  local_2780._24_4_ = -fVar76;
  local_2780._28_4_ = -fVar76;
  auVar106 = ZEXT3264(local_2780);
  local_24e0 = -fVar86;
  fStack_24dc = -fVar86;
  fStack_24d8 = -fVar86;
  fStack_24d4 = -fVar86;
  fStack_24d0 = -fVar86;
  fStack_24cc = -fVar86;
  fStack_24c8 = -fVar86;
  fStack_24c4 = -fVar86;
  local_2500 = (tray->tnear).field_0.i[k];
  iStack_24fc = local_2500;
  iStack_24f8 = local_2500;
  iStack_24f4 = local_2500;
  iStack_24f0 = local_2500;
  iStack_24ec = local_2500;
  iStack_24e8 = local_2500;
  iStack_24e4 = local_2500;
  local_2520 = -fVar94;
  fStack_251c = -fVar94;
  fStack_2518 = -fVar94;
  fStack_2514 = -fVar94;
  fStack_2510 = -fVar94;
  fStack_250c = -fVar94;
  fStack_2508 = -fVar94;
  fStack_2504 = -fVar94;
  local_2808 = local_27d0 >> 2;
  local_2400._16_16_ = mm_lookupmask_ps._240_16_;
  local_2400._0_16_ = mm_lookupmask_ps._0_16_;
  local_2810 = local_27e8 >> 2;
  local_2840 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_2818 = local_27d8 >> 2;
  local_2820 = local_27f0 >> 2;
  local_2828 = local_27e0 >> 2;
  local_2830 = local_27f8 >> 2;
  auVar66._8_4_ = 0xbf800000;
  auVar66._0_8_ = 0xbf800000bf800000;
  auVar66._12_4_ = 0xbf800000;
  auVar66._16_4_ = 0xbf800000;
  auVar66._20_4_ = 0xbf800000;
  auVar66._24_4_ = 0xbf800000;
  auVar66._28_4_ = 0xbf800000;
  auVar78._8_4_ = 0x3f800000;
  auVar78._0_8_ = &DAT_3f8000003f800000;
  auVar78._12_4_ = 0x3f800000;
  auVar78._16_4_ = 0x3f800000;
  auVar78._20_4_ = 0x3f800000;
  auVar78._24_4_ = 0x3f800000;
  auVar78._28_4_ = 0x3f800000;
  _local_2420 = vblendvps_avx(auVar78,auVar66,local_2400);
  iStack_26e8 = iStack_26e4;
  iStack_26ec = iStack_26e4;
  iStack_26f0 = iStack_26e4;
  iStack_26f4 = iStack_26e4;
  iStack_26f8 = iStack_26e4;
  iStack_26fc = iStack_26e4;
  local_2700 = iStack_26e4;
  do {
    do {
      if (local_2898 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar52 = local_2898 + -1;
      local_2898 = local_2898 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar52 + 8));
    local_2890 = *(ulong *)*local_2898;
    do {
      if ((local_2890 & 8) == 0) {
        auVar64 = vfmadd132ps_fma(*(undefined1 (*) [32])(local_2890 + 0x40 + local_27d0),
                                  auVar106._0_32_,auVar108._0_32_);
        auVar23._4_4_ = fStack_24dc;
        auVar23._0_4_ = local_24e0;
        auVar23._8_4_ = fStack_24d8;
        auVar23._12_4_ = fStack_24d4;
        auVar23._16_4_ = fStack_24d0;
        auVar23._20_4_ = fStack_24cc;
        auVar23._24_4_ = fStack_24c8;
        auVar23._28_4_ = fStack_24c4;
        auVar68 = vfmadd132ps_fma(*(undefined1 (*) [32])(local_2890 + 0x40 + local_27d8),auVar23,
                                  auVar109._0_32_);
        auVar66 = vpmaxsd_avx2(ZEXT1632(auVar64),ZEXT1632(auVar68));
        auVar18._4_4_ = fStack_251c;
        auVar18._0_4_ = local_2520;
        auVar18._8_4_ = fStack_2518;
        auVar18._12_4_ = fStack_2514;
        auVar18._16_4_ = fStack_2510;
        auVar18._20_4_ = fStack_250c;
        auVar18._24_4_ = fStack_2508;
        auVar18._28_4_ = fStack_2504;
        auVar64 = vfmadd132ps_fma(*(undefined1 (*) [32])(local_2890 + 0x40 + local_27e0),auVar18,
                                  auVar111._0_32_);
        auVar68 = vfmadd132ps_fma(*(undefined1 (*) [32])(local_2890 + 0x40 + local_27e8),
                                  auVar106._0_32_,auVar108._0_32_);
        auVar77 = vfmadd132ps_fma(*(undefined1 (*) [32])(local_2890 + 0x40 + local_27f0),auVar23,
                                  auVar109._0_32_);
        auVar23 = vpminsd_avx2(ZEXT1632(auVar68),ZEXT1632(auVar77));
        auVar68 = vfmadd132ps_fma(*(undefined1 (*) [32])(local_2890 + 0x40 + local_27f8),auVar18,
                                  auVar111._0_32_);
        auVar19._4_4_ = iStack_24fc;
        auVar19._0_4_ = local_2500;
        auVar19._8_4_ = iStack_24f8;
        auVar19._12_4_ = iStack_24f4;
        auVar19._16_4_ = iStack_24f0;
        auVar19._20_4_ = iStack_24ec;
        auVar19._24_4_ = iStack_24e8;
        auVar19._28_4_ = iStack_24e4;
        auVar78 = vpmaxsd_avx2(ZEXT1632(auVar64),auVar19);
        _local_26c0 = vpmaxsd_avx2(auVar66,auVar78);
        auVar17._4_4_ = iStack_26fc;
        auVar17._0_4_ = local_2700;
        auVar17._8_4_ = iStack_26f8;
        auVar17._12_4_ = iStack_26f4;
        auVar17._16_4_ = iStack_26f0;
        auVar17._20_4_ = iStack_26ec;
        auVar17._24_4_ = iStack_26e8;
        auVar17._28_4_ = iStack_26e4;
        auVar66 = vpminsd_avx2(ZEXT1632(auVar68),auVar17);
        auVar66 = vpminsd_avx2(auVar23,auVar66);
        auVar66 = vpcmpgtd_avx2(_local_26c0,auVar66);
        uVar48 = vmovmskps_avx(auVar66);
        local_2838 = (ulong)(byte)~(byte)uVar48;
      }
      if ((local_2890 & 8) == 0) {
        if (local_2838 == 0) {
          iVar49 = 4;
        }
        else {
          uVar60 = local_2890 & 0xfffffffffffffff0;
          lVar50 = 0;
          for (uVar55 = local_2838; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
            lVar50 = lVar50 + 1;
          }
          iVar49 = 0;
          uVar55 = local_2838 - 1 & local_2838;
          local_2890 = *(ulong *)(uVar60 + lVar50 * 8);
          if (uVar55 != 0) {
            uVar13 = *(uint *)(local_26c0 + lVar50 * 4);
            lVar50 = 0;
            for (uVar61 = uVar55; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
              lVar50 = lVar50 + 1;
            }
            uVar55 = uVar55 - 1 & uVar55;
            uVar61 = *(ulong *)(uVar60 + lVar50 * 8);
            uVar14 = *(uint *)(local_26c0 + lVar50 * 4);
            if (uVar55 == 0) {
              if (uVar13 < uVar14) {
                *(ulong *)*local_2898 = uVar61;
                *(uint *)(*local_2898 + 8) = uVar14;
                local_2898 = local_2898 + 1;
              }
              else {
                *(ulong *)*local_2898 = local_2890;
                *(uint *)(*local_2898 + 8) = uVar13;
                local_2898 = local_2898 + 1;
                local_2890 = uVar61;
              }
            }
            else {
              auVar64._8_8_ = 0;
              auVar64._0_8_ = local_2890;
              auVar64 = vpunpcklqdq_avx(auVar64,ZEXT416(uVar13));
              auVar68._8_8_ = 0;
              auVar68._0_8_ = uVar61;
              auVar68 = vpunpcklqdq_avx(auVar68,ZEXT416(uVar14));
              lVar50 = 0;
              for (uVar61 = uVar55; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
                lVar50 = lVar50 + 1;
              }
              uVar55 = uVar55 - 1 & uVar55;
              auVar77._8_8_ = 0;
              auVar77._0_8_ = *(ulong *)(uVar60 + lVar50 * 8);
              auVar65 = vpunpcklqdq_avx(auVar77,ZEXT416(*(uint *)(local_26c0 + lVar50 * 4)));
              auVar77 = vpcmpgtd_avx(auVar68,auVar64);
              if (uVar55 == 0) {
                auVar100 = vpshufd_avx(auVar77,0xaa);
                auVar77 = vblendvps_avx(auVar68,auVar64,auVar100);
                auVar64 = vblendvps_avx(auVar64,auVar68,auVar100);
                auVar68 = vpcmpgtd_avx(auVar65,auVar77);
                auVar100 = vpshufd_avx(auVar68,0xaa);
                auVar68 = vblendvps_avx(auVar65,auVar77,auVar100);
                auVar77 = vblendvps_avx(auVar77,auVar65,auVar100);
                auVar65 = vpcmpgtd_avx(auVar77,auVar64);
                auVar100 = vpshufd_avx(auVar65,0xaa);
                auVar65 = vblendvps_avx(auVar77,auVar64,auVar100);
                auVar64 = vblendvps_avx(auVar64,auVar77,auVar100);
                *local_2898 = auVar64;
                local_2898[1] = auVar65;
                local_2890 = vmovlps_avx(auVar68);
                local_2898 = local_2898 + 2;
              }
              else {
                lVar50 = 0;
                for (uVar61 = uVar55; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000)
                {
                  lVar50 = lVar50 + 1;
                }
                uVar55 = uVar55 - 1 & uVar55;
                auVar100._8_8_ = 0;
                auVar100._0_8_ = *(ulong *)(uVar60 + lVar50 * 8);
                auVar100 = vpunpcklqdq_avx(auVar100,ZEXT416(*(uint *)(local_26c0 + lVar50 * 4)));
                if (uVar55 == 0) {
                  auVar3 = vpshufd_avx(auVar77,0xaa);
                  auVar77 = vblendvps_avx(auVar68,auVar64,auVar3);
                  auVar64 = vblendvps_avx(auVar64,auVar68,auVar3);
                  auVar68 = vpcmpgtd_avx(auVar100,auVar65);
                  auVar3 = vpshufd_avx(auVar68,0xaa);
                  auVar68 = vblendvps_avx(auVar100,auVar65,auVar3);
                  auVar65 = vblendvps_avx(auVar65,auVar100,auVar3);
                  auVar100 = vpcmpgtd_avx(auVar65,auVar64);
                  auVar3 = vpshufd_avx(auVar100,0xaa);
                  auVar100 = vblendvps_avx(auVar65,auVar64,auVar3);
                  auVar64 = vblendvps_avx(auVar64,auVar65,auVar3);
                  auVar65 = vpcmpgtd_avx(auVar68,auVar77);
                  auVar3 = vpshufd_avx(auVar65,0xaa);
                  auVar65 = vblendvps_avx(auVar68,auVar77,auVar3);
                  auVar68 = vblendvps_avx(auVar77,auVar68,auVar3);
                  auVar77 = vpcmpgtd_avx(auVar100,auVar68);
                  auVar3 = vpshufd_avx(auVar77,0xaa);
                  auVar77 = vblendvps_avx(auVar100,auVar68,auVar3);
                  auVar68 = vblendvps_avx(auVar68,auVar100,auVar3);
                  *local_2898 = auVar64;
                  local_2898[1] = auVar68;
                  local_2898[2] = auVar77;
                  local_2890 = vmovlps_avx(auVar65);
                  pauVar52 = local_2898 + 3;
                }
                else {
                  *local_2898 = auVar64;
                  local_2898[1] = auVar68;
                  local_2898[2] = auVar65;
                  local_2898[3] = auVar100;
                  lVar50 = 0x30;
                  do {
                    lVar56 = lVar50;
                    lVar50 = 0;
                    for (uVar61 = uVar55; (uVar61 & 1) == 0;
                        uVar61 = uVar61 >> 1 | 0x8000000000000000) {
                      lVar50 = lVar50 + 1;
                    }
                    auVar65._8_8_ = 0;
                    auVar65._0_8_ = *(ulong *)(uVar60 + lVar50 * 8);
                    auVar64 = vpunpcklqdq_avx(auVar65,ZEXT416(*(uint *)(local_26c0 + lVar50 * 4)));
                    *(undefined1 (*) [16])(local_2898[1] + lVar56) = auVar64;
                    uVar55 = uVar55 - 1 & uVar55;
                    lVar50 = lVar56 + 0x10;
                  } while (uVar55 != 0);
                  pauVar52 = (undefined1 (*) [16])(local_2898[1] + lVar56);
                  if (lVar56 + 0x10 != 0) {
                    lVar50 = 0x10;
                    pauVar53 = local_2898;
                    do {
                      auVar64 = pauVar53[1];
                      uVar13 = *(uint *)(pauVar53[1] + 8);
                      pauVar53 = pauVar53 + 1;
                      lVar56 = lVar50;
                      do {
                        if (uVar13 <= *(uint *)(local_2898[-1] + lVar56 + 8)) {
                          pauVar57 = (undefined1 (*) [16])(*local_2898 + lVar56);
                          break;
                        }
                        *(undefined1 (*) [16])(*local_2898 + lVar56) =
                             *(undefined1 (*) [16])(local_2898[-1] + lVar56);
                        lVar56 = lVar56 + -0x10;
                        pauVar57 = local_2898;
                      } while (lVar56 != 0);
                      *pauVar57 = auVar64;
                      lVar50 = lVar50 + 0x10;
                    } while (pauVar52 != pauVar53);
                  }
                  local_2890 = *(ulong *)*pauVar52;
                }
                auVar108 = ZEXT3264(local_2720);
                auVar109 = ZEXT3264(local_2740);
                auVar111 = ZEXT3264(local_2760);
                local_2898 = pauVar52;
              }
              auVar106 = ZEXT3264(local_2780);
            }
          }
        }
      }
      else {
        iVar49 = 6;
      }
    } while (iVar49 == 0);
    if (iVar49 == 6) {
      local_2800 = (ulong)((uint)local_2890 & 0xf) - 8;
      if (local_2800 != 0) {
        local_2890 = local_2890 & 0xfffffffffffffff0;
        local_27c8 = 0;
        do {
          lVar50 = local_27c8 * 0x90;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(local_2890 + 0x40 + lVar50);
          auVar68 = vpmovzxbw_avx(auVar3);
          local_27c0 = local_2890 + lVar50;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(local_2890 + 0x48 + lVar50);
          auVar64 = vpmovzxbw_avx(auVar4);
          auVar64 = vpminuw_avx(auVar68,auVar64);
          auVar64 = vpcmpeqw_avx(auVar68,auVar64);
          auVar64 = vpacksswb_avx(auVar64,auVar64);
          uVar48 = *(undefined4 *)(local_2890 + 0x70 + lVar50);
          auVar88._4_4_ = uVar48;
          auVar88._0_4_ = uVar48;
          auVar88._8_4_ = uVar48;
          auVar88._12_4_ = uVar48;
          auVar88._16_4_ = uVar48;
          auVar88._20_4_ = uVar48;
          auVar88._24_4_ = uVar48;
          auVar88._28_4_ = uVar48;
          uVar48 = *(undefined4 *)(local_2890 + 0x7c + lVar50);
          auVar102._4_4_ = uVar48;
          auVar102._0_4_ = uVar48;
          auVar102._8_4_ = uVar48;
          auVar102._12_4_ = uVar48;
          auVar102._16_4_ = uVar48;
          auVar102._20_4_ = uVar48;
          auVar102._24_4_ = uVar48;
          auVar102._28_4_ = uVar48;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(local_2808 + 0x40 + local_27c0);
          auVar66 = vpmovzxbd_avx2(auVar5);
          auVar66 = vcvtdq2ps_avx(auVar66);
          auVar68 = vfmadd213ps_fma(auVar66,auVar102,auVar88);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(local_2810 + 0x40 + local_27c0);
          auVar66 = vpmovzxbd_avx2(auVar6);
          auVar66 = vcvtdq2ps_avx(auVar66);
          auVar77 = vfmadd213ps_fma(auVar66,auVar102,auVar88);
          uVar48 = *(undefined4 *)(local_2890 + 0x74 + lVar50);
          auVar89._4_4_ = uVar48;
          auVar89._0_4_ = uVar48;
          auVar89._8_4_ = uVar48;
          auVar89._12_4_ = uVar48;
          auVar89._16_4_ = uVar48;
          auVar89._20_4_ = uVar48;
          auVar89._24_4_ = uVar48;
          auVar89._28_4_ = uVar48;
          uVar48 = *(undefined4 *)(local_2890 + 0x80 + lVar50);
          auVar103._4_4_ = uVar48;
          auVar103._0_4_ = uVar48;
          auVar103._8_4_ = uVar48;
          auVar103._12_4_ = uVar48;
          auVar103._16_4_ = uVar48;
          auVar103._20_4_ = uVar48;
          auVar103._24_4_ = uVar48;
          auVar103._28_4_ = uVar48;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)(local_2818 + 0x40 + local_27c0);
          auVar66 = vpmovzxbd_avx2(auVar7);
          auVar66 = vcvtdq2ps_avx(auVar66);
          auVar65 = vfmadd213ps_fma(auVar66,auVar103,auVar89);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)(local_2820 + 0x40 + local_27c0);
          auVar66 = vpmovzxbd_avx2(auVar8);
          auVar66 = vcvtdq2ps_avx(auVar66);
          auVar100 = vfmadd213ps_fma(auVar66,auVar103,auVar89);
          uVar48 = *(undefined4 *)(local_2890 + 0x78 + lVar50);
          auVar90._4_4_ = uVar48;
          auVar90._0_4_ = uVar48;
          auVar90._8_4_ = uVar48;
          auVar90._12_4_ = uVar48;
          auVar90._16_4_ = uVar48;
          auVar90._20_4_ = uVar48;
          auVar90._24_4_ = uVar48;
          auVar90._28_4_ = uVar48;
          uVar48 = *(undefined4 *)(local_2890 + 0x84 + lVar50);
          auVar104._4_4_ = uVar48;
          auVar104._0_4_ = uVar48;
          auVar104._8_4_ = uVar48;
          auVar104._12_4_ = uVar48;
          auVar104._16_4_ = uVar48;
          auVar104._20_4_ = uVar48;
          auVar104._24_4_ = uVar48;
          auVar104._28_4_ = uVar48;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(local_2828 + 0x40 + local_27c0);
          auVar66 = vpmovzxbd_avx2(auVar9);
          auVar66 = vcvtdq2ps_avx(auVar66);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)(local_2830 + 0x40 + local_27c0);
          auVar78 = vpmovzxbd_avx2(auVar10);
          auVar3 = vfmadd213ps_fma(auVar66,auVar104,auVar90);
          auVar66 = vcvtdq2ps_avx(auVar78);
          auVar4 = vfmadd213ps_fma(auVar66,auVar104,auVar90);
          auVar68 = vfmadd213ps_fma(ZEXT1632(auVar68),local_2720,local_2780);
          auVar47._4_4_ = fStack_24dc;
          auVar47._0_4_ = local_24e0;
          auVar47._8_4_ = fStack_24d8;
          auVar47._12_4_ = fStack_24d4;
          auVar47._16_4_ = fStack_24d0;
          auVar47._20_4_ = fStack_24cc;
          auVar47._24_4_ = fStack_24c8;
          auVar47._28_4_ = fStack_24c4;
          auVar65 = vfmadd213ps_fma(ZEXT1632(auVar65),local_2740,auVar47);
          auVar66 = vpmaxsd_avx2(ZEXT1632(auVar68),ZEXT1632(auVar65));
          auVar20._4_4_ = fStack_251c;
          auVar20._0_4_ = local_2520;
          auVar20._8_4_ = fStack_2518;
          auVar20._12_4_ = fStack_2514;
          auVar20._16_4_ = fStack_2510;
          auVar20._20_4_ = fStack_250c;
          auVar20._24_4_ = fStack_2508;
          auVar20._28_4_ = fStack_2504;
          auVar68 = vfmadd213ps_fma(ZEXT1632(auVar3),local_2760,auVar20);
          auVar77 = vfmadd213ps_fma(ZEXT1632(auVar77),local_2720,local_2780);
          auVar65 = vfmadd213ps_fma(ZEXT1632(auVar100),local_2740,auVar47);
          auVar23 = vpminsd_avx2(ZEXT1632(auVar77),ZEXT1632(auVar65));
          auVar77 = vfmadd213ps_fma(ZEXT1632(auVar4),local_2760,auVar20);
          auVar22._4_4_ = iStack_24fc;
          auVar22._0_4_ = local_2500;
          auVar22._8_4_ = iStack_24f8;
          auVar22._12_4_ = iStack_24f4;
          auVar22._16_4_ = iStack_24f0;
          auVar22._20_4_ = iStack_24ec;
          auVar22._24_4_ = iStack_24e8;
          auVar22._28_4_ = iStack_24e4;
          auVar78 = vpmaxsd_avx2(ZEXT1632(auVar68),auVar22);
          local_23c0 = vpmaxsd_avx2(auVar66,auVar78);
          auVar21._4_4_ = iStack_26fc;
          auVar21._0_4_ = local_2700;
          auVar21._8_4_ = iStack_26f8;
          auVar21._12_4_ = iStack_26f4;
          auVar21._16_4_ = iStack_26f0;
          auVar21._20_4_ = iStack_26ec;
          auVar21._24_4_ = iStack_26e8;
          auVar21._28_4_ = iStack_26e4;
          auVar66 = vpminsd_avx2(ZEXT1632(auVar77),auVar21);
          auVar66 = vpminsd_avx2(auVar23,auVar66);
          auVar66 = vpcmpgtd_avx2(local_23c0,auVar66);
          uVar48 = vmovmskps_avx(auVar66);
          bVar51 = ~(byte)uVar48 &
                   (SUB161(auVar64 >> 7,0) & 1 | (SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                    (SUB161(auVar64 >> 0x17,0) & 1) << 2 | (SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                    (SUB161(auVar64 >> 0x27,0) & 1) << 4 | (SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                    (SUB161(auVar64 >> 0x37,0) & 1) << 6 | SUB161(auVar64 >> 0x3f,0) << 7);
          if (bVar51 != 0) {
            local_27b8 = (ulong)bVar51;
            do {
              lVar50 = 0;
              for (uVar55 = local_27b8; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000
                  ) {
                lVar50 = lVar50 + 1;
              }
              fVar76 = *(float *)(ray + k * 4 + 0x80);
              if (*(float *)(local_23c0 + lVar50 * 4) <= fVar76) {
                uVar11 = *(ushort *)(local_27c0 + lVar50 * 8);
                uVar12 = *(ushort *)(local_27c0 + 2 + lVar50 * 8);
                uVar13 = *(uint *)(local_27c0 + 0x88);
                uVar14 = *(uint *)(local_27c0 + 4 + lVar50 * 8);
                pGVar15 = (context->scene->geometries).items[uVar13].ptr;
                lVar50 = *(long *)&pGVar15->field_0x58;
                lVar54 = pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                         _M_i * (ulong)uVar14;
                uVar58 = uVar11 & 0x7fff;
                uVar59 = uVar12 & 0x7fff;
                uVar116 = *(uint *)(lVar50 + 4 + lVar54);
                uVar61 = (ulong)uVar116;
                uVar60 = (ulong)(uVar116 * uVar59 + *(int *)(lVar50 + lVar54) + uVar58);
                p_Var16 = pGVar15[1].intersectionFilterN;
                lVar56 = *(long *)&pGVar15[1].time_range.upper;
                auVar64 = *(undefined1 (*) [16])(lVar56 + (uVar60 + 1) * (long)p_Var16);
                auVar68 = *(undefined1 (*) [16])(lVar56 + (uVar60 + uVar61) * (long)p_Var16);
                lVar63 = uVar60 + uVar61 + 1;
                auVar77 = *(undefined1 (*) [16])(lVar56 + lVar63 * (long)p_Var16);
                auVar65 = *(undefined1 (*) [16])
                           (lVar56 + (uVar60 + (-1 < (short)uVar11) + 1) * (long)p_Var16);
                lVar62 = (ulong)(-1 < (short)uVar11) + lVar63;
                auVar100 = *(undefined1 (*) [16])(lVar56 + lVar62 * (long)p_Var16);
                uVar55 = 0;
                if (-1 < (short)uVar12) {
                  uVar55 = uVar61;
                }
                auVar3 = *(undefined1 (*) [16])(lVar56 + (uVar60 + uVar61 + uVar55) * (long)p_Var16)
                ;
                auVar4 = *(undefined1 (*) [16])(lVar56 + (lVar63 + uVar55) * (long)p_Var16);
                auVar114._16_16_ =
                     *(undefined1 (*) [16])(lVar56 + (uVar55 + lVar62) * (long)p_Var16);
                auVar114._0_16_ = auVar77;
                auVar6 = vunpcklps_avx(auVar64,auVar100);
                auVar5 = vunpckhps_avx(auVar64,auVar100);
                auVar7 = vunpcklps_avx(auVar65,auVar77);
                auVar65 = vunpckhps_avx(auVar65,auVar77);
                auVar8 = vunpcklps_avx(auVar5,auVar65);
                auVar9 = vunpcklps_avx(auVar6,auVar7);
                auVar65 = vunpckhps_avx(auVar6,auVar7);
                auVar6 = vunpcklps_avx(auVar68,auVar4);
                auVar5 = vunpckhps_avx(auVar68,auVar4);
                auVar7 = vunpcklps_avx(auVar77,auVar3);
                auVar3 = vunpckhps_avx(auVar77,auVar3);
                auVar5 = vunpcklps_avx(auVar5,auVar3);
                auVar10 = vunpcklps_avx(auVar6,auVar7);
                auVar3 = vunpckhps_avx(auVar6,auVar7);
                auVar91._16_16_ = auVar4;
                auVar91._0_16_ = auVar68;
                auVar79._16_16_ = auVar100;
                auVar79._0_16_ = auVar64;
                auVar66 = vunpcklps_avx(auVar79,auVar91);
                auVar71._16_16_ = auVar77;
                auVar71._0_16_ = *(undefined1 (*) [16])(lVar56 + (long)p_Var16 * uVar60);
                auVar78 = vunpcklps_avx(auVar71,auVar114);
                auVar21 = vunpcklps_avx(auVar78,auVar66);
                auVar20 = vunpckhps_avx(auVar78,auVar66);
                auVar66 = vunpckhps_avx(auVar79,auVar91);
                auVar78 = vunpckhps_avx(auVar71,auVar114);
                auVar22 = vunpcklps_avx(auVar78,auVar66);
                auVar72._16_16_ = auVar9;
                auVar72._0_16_ = auVar9;
                auVar92._16_16_ = auVar65;
                auVar92._0_16_ = auVar65;
                auVar105._16_16_ = auVar8;
                auVar105._0_16_ = auVar8;
                auVar112._16_16_ = auVar10;
                auVar112._0_16_ = auVar10;
                auVar123._16_16_ = auVar3;
                auVar123._0_16_ = auVar3;
                auVar125._16_16_ = auVar5;
                auVar125._0_16_ = auVar5;
                auVar78 = vsubps_avx(auVar21,auVar72);
                auVar66 = vsubps_avx(auVar20,auVar92);
                auVar23 = vsubps_avx(auVar22,auVar105);
                auVar17 = vsubps_avx(auVar112,auVar21);
                auVar18 = vsubps_avx(auVar123,auVar20);
                auVar19 = vsubps_avx(auVar125,auVar22);
                auVar24._4_4_ = auVar66._4_4_ * auVar19._4_4_;
                auVar24._0_4_ = auVar66._0_4_ * auVar19._0_4_;
                auVar24._8_4_ = auVar66._8_4_ * auVar19._8_4_;
                auVar24._12_4_ = auVar66._12_4_ * auVar19._12_4_;
                auVar24._16_4_ = auVar66._16_4_ * auVar19._16_4_;
                auVar24._20_4_ = auVar66._20_4_ * auVar19._20_4_;
                auVar24._24_4_ = auVar66._24_4_ * auVar19._24_4_;
                auVar24._28_4_ = auVar9._12_4_;
                auVar100 = vfmsub231ps_fma(auVar24,auVar18,auVar23);
                uVar48 = *(undefined4 *)(ray + k * 4);
                auVar128._4_4_ = uVar48;
                auVar128._0_4_ = uVar48;
                auVar128._8_4_ = uVar48;
                auVar128._12_4_ = uVar48;
                auVar128._16_4_ = uVar48;
                auVar128._20_4_ = uVar48;
                auVar128._24_4_ = uVar48;
                auVar128._28_4_ = uVar48;
                uVar48 = *(undefined4 *)(ray + k * 4 + 0x10);
                auVar130._4_4_ = uVar48;
                auVar130._0_4_ = uVar48;
                auVar130._8_4_ = uVar48;
                auVar130._12_4_ = uVar48;
                auVar130._16_4_ = uVar48;
                auVar130._20_4_ = uVar48;
                auVar130._24_4_ = uVar48;
                auVar130._28_4_ = uVar48;
                uVar48 = *(undefined4 *)(ray + k * 4 + 0x20);
                auVar132._4_4_ = uVar48;
                auVar132._0_4_ = uVar48;
                auVar132._8_4_ = uVar48;
                auVar132._12_4_ = uVar48;
                auVar132._16_4_ = uVar48;
                auVar132._20_4_ = uVar48;
                auVar132._24_4_ = uVar48;
                auVar132._28_4_ = uVar48;
                fVar86 = *(float *)(ray + k * 4 + 0x40);
                auVar124._4_4_ = fVar86;
                auVar124._0_4_ = fVar86;
                auVar124._8_4_ = fVar86;
                auVar124._12_4_ = fVar86;
                auVar124._16_4_ = fVar86;
                auVar124._20_4_ = fVar86;
                auVar124._24_4_ = fVar86;
                auVar124._28_4_ = fVar86;
                auVar25._4_4_ = auVar23._4_4_ * auVar17._4_4_;
                auVar25._0_4_ = auVar23._0_4_ * auVar17._0_4_;
                auVar25._8_4_ = auVar23._8_4_ * auVar17._8_4_;
                auVar25._12_4_ = auVar23._12_4_ * auVar17._12_4_;
                auVar25._16_4_ = auVar23._16_4_ * auVar17._16_4_;
                auVar25._20_4_ = auVar23._20_4_ * auVar17._20_4_;
                auVar25._24_4_ = auVar23._24_4_ * auVar17._24_4_;
                auVar25._28_4_ = auVar65._12_4_;
                auVar21 = vsubps_avx(auVar21,auVar128);
                fVar94 = *(float *)(ray + k * 4 + 0x50);
                auVar127._4_4_ = fVar94;
                auVar127._0_4_ = fVar94;
                auVar127._8_4_ = fVar94;
                auVar127._12_4_ = fVar94;
                auVar129._16_4_ = fVar94;
                auVar129._0_16_ = auVar127;
                auVar129._20_4_ = fVar94;
                auVar129._24_4_ = fVar94;
                auVar129._28_4_ = fVar94;
                auVar65 = vfmsub231ps_fma(auVar25,auVar19,auVar78);
                auVar20 = vsubps_avx(auVar20,auVar130);
                fVar120 = *(float *)(ray + k * 4 + 0x60);
                auVar131._4_4_ = fVar120;
                auVar131._0_4_ = fVar120;
                auVar131._8_4_ = fVar120;
                auVar131._12_4_ = fVar120;
                auVar131._16_4_ = fVar120;
                auVar131._20_4_ = fVar120;
                auVar131._24_4_ = fVar120;
                auVar131._28_4_ = fVar120;
                auVar22 = vsubps_avx(auVar22,auVar132);
                auVar26._4_4_ = fVar86 * auVar20._4_4_;
                auVar26._0_4_ = fVar86 * auVar20._0_4_;
                auVar26._8_4_ = fVar86 * auVar20._8_4_;
                auVar26._12_4_ = fVar86 * auVar20._12_4_;
                auVar26._16_4_ = fVar86 * auVar20._16_4_;
                auVar26._20_4_ = fVar86 * auVar20._20_4_;
                auVar26._24_4_ = fVar86 * auVar20._24_4_;
                auVar26._28_4_ = uVar48;
                auVar64 = vfmsub231ps_fma(auVar26,auVar21,auVar129);
                auVar27._4_4_ = auVar19._4_4_ * auVar64._4_4_;
                auVar27._0_4_ = auVar19._0_4_ * auVar64._0_4_;
                auVar27._8_4_ = auVar19._8_4_ * auVar64._8_4_;
                auVar27._12_4_ = auVar19._12_4_ * auVar64._12_4_;
                auVar27._16_4_ = auVar19._16_4_ * 0.0;
                auVar27._20_4_ = auVar19._20_4_ * 0.0;
                auVar27._24_4_ = auVar19._24_4_ * 0.0;
                auVar27._28_4_ = auVar19._28_4_;
                auVar133._0_4_ = auVar23._0_4_ * auVar64._0_4_;
                auVar133._4_4_ = auVar23._4_4_ * auVar64._4_4_;
                auVar133._8_4_ = auVar23._8_4_ * auVar64._8_4_;
                auVar133._12_4_ = auVar23._12_4_ * auVar64._12_4_;
                auVar133._16_4_ = auVar23._16_4_ * 0.0;
                auVar133._20_4_ = auVar23._20_4_ * 0.0;
                auVar133._24_4_ = auVar23._24_4_ * 0.0;
                auVar133._28_4_ = 0;
                auVar28._4_4_ = fVar120 * auVar21._4_4_;
                auVar28._0_4_ = fVar120 * auVar21._0_4_;
                auVar28._8_4_ = fVar120 * auVar21._8_4_;
                auVar28._12_4_ = fVar120 * auVar21._12_4_;
                auVar28._16_4_ = fVar120 * auVar21._16_4_;
                auVar28._20_4_ = fVar120 * auVar21._20_4_;
                auVar28._24_4_ = fVar120 * auVar21._24_4_;
                auVar28._28_4_ = auVar23._28_4_;
                auVar68 = vfmsub231ps_fma(auVar28,auVar22,auVar124);
                auVar64 = vfmadd231ps_fma(auVar27,ZEXT1632(auVar68),auVar18);
                auVar68 = vfmadd231ps_fma(auVar133,auVar66,ZEXT1632(auVar68));
                auVar29._4_4_ = auVar78._4_4_ * auVar18._4_4_;
                auVar29._0_4_ = auVar78._0_4_ * auVar18._0_4_;
                auVar29._8_4_ = auVar78._8_4_ * auVar18._8_4_;
                auVar29._12_4_ = auVar78._12_4_ * auVar18._12_4_;
                auVar29._16_4_ = auVar78._16_4_ * auVar18._16_4_;
                auVar29._20_4_ = auVar78._20_4_ * auVar18._20_4_;
                auVar29._24_4_ = auVar78._24_4_ * auVar18._24_4_;
                auVar29._28_4_ = auVar18._28_4_;
                auVar77 = vfmsub231ps_fma(auVar29,auVar17,auVar66);
                auVar30._4_4_ = fVar94 * auVar22._4_4_;
                auVar30._0_4_ = fVar94 * auVar22._0_4_;
                auVar30._8_4_ = fVar94 * auVar22._8_4_;
                auVar30._12_4_ = fVar94 * auVar22._12_4_;
                auVar30._16_4_ = fVar94 * auVar22._16_4_;
                auVar30._20_4_ = fVar94 * auVar22._20_4_;
                auVar30._24_4_ = fVar94 * auVar22._24_4_;
                auVar30._28_4_ = auVar66._28_4_;
                auVar3 = vfmsub231ps_fma(auVar30,auVar20,auVar131);
                fVar86 = auVar77._0_4_;
                fVar94 = auVar77._4_4_;
                auVar31._4_4_ = fVar120 * fVar94;
                auVar31._0_4_ = fVar120 * fVar86;
                fVar95 = auVar77._8_4_;
                auVar31._8_4_ = fVar120 * fVar95;
                fVar96 = auVar77._12_4_;
                auVar31._12_4_ = fVar120 * fVar96;
                auVar31._16_4_ = fVar120 * 0.0;
                auVar31._20_4_ = fVar120 * 0.0;
                auVar31._24_4_ = fVar120 * 0.0;
                auVar31._28_4_ = fVar120;
                auVar77 = vfmadd231ps_fma(auVar31,ZEXT1632(auVar65),auVar129);
                auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),ZEXT1632(auVar100),auVar124);
                auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),ZEXT1632(auVar3),auVar17);
                auVar66 = vandps_avx(ZEXT1632(auVar77),local_23e0);
                uVar116 = auVar66._0_4_;
                auVar113._0_4_ = (float)(uVar116 ^ auVar64._0_4_);
                uVar117 = auVar66._4_4_;
                auVar113._4_4_ = (float)(uVar117 ^ auVar64._4_4_);
                uVar118 = auVar66._8_4_;
                auVar113._8_4_ = (float)(uVar118 ^ auVar64._8_4_);
                uVar119 = auVar66._12_4_;
                auVar113._12_4_ = (float)(uVar119 ^ auVar64._12_4_);
                fVar120 = auVar66._16_4_;
                auVar113._16_4_ = fVar120;
                fVar121 = auVar66._20_4_;
                auVar113._20_4_ = fVar121;
                fVar122 = auVar66._24_4_;
                auVar113._24_4_ = fVar122;
                fVar97 = auVar66._28_4_;
                auVar113._28_4_ = fVar97;
                auVar64 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar78,ZEXT1632(auVar3));
                auVar115._0_4_ = (float)(uVar116 ^ auVar64._0_4_);
                auVar115._4_4_ = (float)(uVar117 ^ auVar64._4_4_);
                auVar115._8_4_ = (float)(uVar118 ^ auVar64._8_4_);
                auVar115._12_4_ = (float)(uVar119 ^ auVar64._12_4_);
                auVar115._16_4_ = fVar120;
                auVar115._20_4_ = fVar121;
                auVar115._24_4_ = fVar122;
                auVar115._28_4_ = fVar97;
                auVar66 = vcmpps_avx(auVar113,ZEXT832(0) << 0x20,5);
                auVar78 = vcmpps_avx(auVar115,ZEXT832(0) << 0x20,5);
                auVar66 = vandps_avx(auVar78,auVar66);
                auVar80._8_4_ = 0x7fffffff;
                auVar80._0_8_ = 0x7fffffff7fffffff;
                auVar80._12_4_ = 0x7fffffff;
                auVar80._16_4_ = 0x7fffffff;
                auVar80._20_4_ = 0x7fffffff;
                auVar80._24_4_ = 0x7fffffff;
                auVar80._28_4_ = 0x7fffffff;
                local_2660 = vandps_avx(ZEXT1632(auVar77),auVar80);
                auVar78 = vcmpps_avx(ZEXT1632(auVar77),ZEXT832(0) << 0x20,4);
                auVar66 = vandps_avx(auVar66,auVar78);
                auVar126._0_4_ = auVar113._0_4_ + auVar115._0_4_;
                auVar126._4_4_ = auVar113._4_4_ + auVar115._4_4_;
                auVar126._8_4_ = auVar113._8_4_ + auVar115._8_4_;
                auVar126._12_4_ = auVar113._12_4_ + auVar115._12_4_;
                auVar126._16_4_ = fVar120 + fVar120;
                auVar126._20_4_ = fVar121 + fVar121;
                auVar126._24_4_ = fVar122 + fVar122;
                auVar126._28_4_ = fVar97 + fVar97;
                auVar78 = vcmpps_avx(auVar126,local_2660,2);
                auVar23 = auVar78 & auVar66;
                if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar23 >> 0x7f,0) != '\0') ||
                      (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0xbf,0) != '\0') ||
                    (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar23[0x1f] < '\0') {
                  auVar66 = vandps_avx(auVar66,auVar78);
                  auVar64 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
                  auVar32._4_4_ = fVar94 * auVar22._4_4_;
                  auVar32._0_4_ = fVar86 * auVar22._0_4_;
                  auVar32._8_4_ = fVar95 * auVar22._8_4_;
                  auVar32._12_4_ = fVar96 * auVar22._12_4_;
                  auVar32._16_4_ = auVar22._16_4_ * 0.0;
                  auVar32._20_4_ = auVar22._20_4_ * 0.0;
                  auVar32._24_4_ = auVar22._24_4_ * 0.0;
                  auVar32._28_4_ = auVar22._28_4_;
                  auVar68 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar65),auVar32);
                  auVar68 = vfmadd213ps_fma(auVar21,ZEXT1632(auVar100),ZEXT1632(auVar68));
                  local_2680._0_4_ = (float)(uVar116 ^ auVar68._0_4_);
                  local_2680._4_4_ = (float)(uVar117 ^ auVar68._4_4_);
                  local_2680._8_4_ = (float)(uVar118 ^ auVar68._8_4_);
                  local_2680._12_4_ = (float)(uVar119 ^ auVar68._12_4_);
                  local_2680._16_4_ = fVar120;
                  local_2680._20_4_ = fVar121;
                  local_2680._24_4_ = fVar122;
                  local_2680._28_4_ = fVar97;
                  fVar97 = *(float *)(ray + k * 4 + 0x30);
                  fVar98 = local_2660._0_4_;
                  fVar99 = local_2660._4_4_;
                  auVar33._4_4_ = fVar99 * fVar97;
                  auVar33._0_4_ = fVar98 * fVar97;
                  fVar81 = local_2660._8_4_;
                  auVar33._8_4_ = fVar81 * fVar97;
                  fVar82 = local_2660._12_4_;
                  auVar33._12_4_ = fVar82 * fVar97;
                  fVar83 = local_2660._16_4_;
                  auVar33._16_4_ = fVar83 * fVar97;
                  fVar84 = local_2660._20_4_;
                  auVar33._20_4_ = fVar84 * fVar97;
                  fVar85 = local_2660._24_4_;
                  auVar33._24_4_ = fVar85 * fVar97;
                  auVar33._28_4_ = fVar97;
                  auVar66 = vcmpps_avx(auVar33,local_2680,1);
                  auVar34._4_4_ = fVar76 * fVar99;
                  auVar34._0_4_ = fVar76 * fVar98;
                  auVar34._8_4_ = fVar76 * fVar81;
                  auVar34._12_4_ = fVar76 * fVar82;
                  auVar34._16_4_ = fVar76 * fVar83;
                  auVar34._20_4_ = fVar76 * fVar84;
                  auVar34._24_4_ = fVar76 * fVar85;
                  auVar34._28_4_ = fVar76;
                  auVar78 = vcmpps_avx(local_2680,auVar34,2);
                  auVar66 = vandps_avx(auVar78,auVar66);
                  auVar68 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
                  auVar64 = vpand_avx(auVar64,auVar68);
                  auVar66 = vpmovzxwd_avx2(auVar64);
                  auVar66 = vpslld_avx2(auVar66,0x1f);
                  if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar66 >> 0x7f,0) != '\0') ||
                        (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar66 >> 0xbf,0) != '\0') ||
                      (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar66[0x1f] < '\0') {
                    local_2620 = vpsrad_avx2(auVar66,0x1f);
                    auVar66 = vsubps_avx(local_2660,auVar115);
                    auVar66 = vblendvps_avx(auVar113,auVar66,local_2400);
                    auVar78 = vsubps_avx(local_2660,auVar113);
                    auVar78 = vblendvps_avx(auVar115,auVar78,local_2400);
                    local_25a0._0_4_ = (float)local_2420._0_4_ * auVar100._0_4_;
                    local_25a0._4_4_ = (float)local_2420._4_4_ * auVar100._4_4_;
                    local_25a0._8_4_ = fStack_2418 * auVar100._8_4_;
                    local_25a0._12_4_ = fStack_2414 * auVar100._12_4_;
                    local_25a0._16_4_ = fStack_2410 * 0.0;
                    local_25a0._20_4_ = fStack_240c * 0.0;
                    local_25a0._24_4_ = fStack_2408 * 0.0;
                    local_25a0._28_4_ = 0;
                    local_2580._4_4_ = (float)local_2420._4_4_ * auVar65._4_4_;
                    local_2580._0_4_ = (float)local_2420._0_4_ * auVar65._0_4_;
                    local_2580._8_4_ = fStack_2418 * auVar65._8_4_;
                    local_2580._12_4_ = fStack_2414 * auVar65._12_4_;
                    local_2580._16_4_ = fStack_2410 * 0.0;
                    local_2580._20_4_ = fStack_240c * 0.0;
                    local_2580._24_4_ = fStack_2408 * 0.0;
                    local_2580._28_4_ = 0;
                    local_2560._4_4_ = (float)local_2420._4_4_ * fVar94;
                    local_2560._0_4_ = (float)local_2420._0_4_ * fVar86;
                    local_2560._8_4_ = fStack_2418 * fVar95;
                    local_2560._12_4_ = fStack_2414 * fVar96;
                    local_2560._16_4_ = fStack_2410 * 0.0;
                    local_2560._20_4_ = fStack_240c * 0.0;
                    local_2560._24_4_ = fStack_2408 * 0.0;
                    local_2560._28_4_ = 0;
                    auVar73._0_8_ = (ulong)CONCAT24(uVar11,(uint)uVar11) & 0x7fff00007fff;
                    auVar73._8_4_ = uVar58;
                    auVar73._12_4_ = uVar58;
                    auVar73._16_4_ = uVar58;
                    auVar73._20_4_ = uVar58;
                    auVar73._24_4_ = uVar58;
                    auVar73._28_4_ = uVar58;
                    auVar23 = vpaddd_avx2(auVar73,_DAT_0205d4c0);
                    auVar101._0_4_ = (float)(int)(*(ushort *)(lVar50 + 8 + lVar54) - 1);
                    auVar101._4_12_ = auVar127._4_12_;
                    auVar93._0_8_ = (ulong)CONCAT24(uVar12,(uint)uVar12) & 0x7fff00007fff;
                    auVar93._8_4_ = uVar59;
                    auVar93._12_4_ = uVar59;
                    auVar93._16_4_ = uVar59;
                    auVar93._20_4_ = uVar59;
                    auVar93._24_4_ = uVar59;
                    auVar93._28_4_ = uVar59;
                    auVar17 = vpaddd_avx2(auVar93,_DAT_0205d4e0);
                    auVar64 = vrcpss_avx(auVar101,auVar101);
                    auVar110._0_4_ = (float)(int)(*(ushort *)(lVar50 + 10 + lVar54) - 1);
                    auVar110._4_12_ = auVar127._4_12_;
                    auVar68 = vfnmadd213ss_fma(auVar101,auVar64,SUB6416(ZEXT464(0x40000000),0));
                    fStack_26a8 = auVar64._0_4_ * auVar68._0_4_;
                    auVar64 = vrcpss_avx(auVar110,auVar110);
                    auVar68 = vfnmadd213ss_fma(auVar110,auVar64,SUB6416(ZEXT464(0x40000000),0));
                    fVar76 = auVar64._0_4_ * auVar68._0_4_;
                    auVar23 = vcvtdq2ps_avx(auVar23);
                    fStack_26a4 = auVar23._28_4_ + auVar66._28_4_;
                    local_26c0._0_4_ = (fVar98 * auVar23._0_4_ + auVar66._0_4_) * fStack_26a8;
                    local_26c0._4_4_ = (fVar99 * auVar23._4_4_ + auVar66._4_4_) * fStack_26a8;
                    fStack_26b8 = (fVar81 * auVar23._8_4_ + auVar66._8_4_) * fStack_26a8;
                    fStack_26b4 = (fVar82 * auVar23._12_4_ + auVar66._12_4_) * fStack_26a8;
                    fStack_26b0 = (fVar83 * auVar23._16_4_ + auVar66._16_4_) * fStack_26a8;
                    fStack_26ac = (fVar84 * auVar23._20_4_ + auVar66._20_4_) * fStack_26a8;
                    fStack_26a8 = (fVar85 * auVar23._24_4_ + auVar66._24_4_) * fStack_26a8;
                    auVar66 = vcvtdq2ps_avx(auVar17);
                    fVar86 = (fVar98 * auVar66._0_4_ + auVar78._0_4_) * fVar76;
                    fVar94 = (fVar99 * auVar66._4_4_ + auVar78._4_4_) * fVar76;
                    local_26a0._4_4_ = fVar94;
                    local_26a0._0_4_ = fVar86;
                    fVar95 = (fVar81 * auVar66._8_4_ + auVar78._8_4_) * fVar76;
                    local_26a0._8_4_ = fVar95;
                    fVar96 = (fVar82 * auVar66._12_4_ + auVar78._12_4_) * fVar76;
                    local_26a0._12_4_ = fVar96;
                    fVar97 = (fVar83 * auVar66._16_4_ + auVar78._16_4_) * fVar76;
                    local_26a0._16_4_ = fVar97;
                    fVar98 = (fVar84 * auVar66._20_4_ + auVar78._20_4_) * fVar76;
                    local_26a0._20_4_ = fVar98;
                    fVar99 = (fVar85 * auVar66._24_4_ + auVar78._24_4_) * fVar76;
                    local_26a0._24_4_ = fVar99;
                    local_26a0._28_4_ = fVar76;
                    if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar66 = vrcpps_avx(local_2660);
                      auVar107._8_4_ = 0x3f800000;
                      auVar107._0_8_ = &DAT_3f8000003f800000;
                      auVar107._12_4_ = 0x3f800000;
                      auVar107._16_4_ = 0x3f800000;
                      auVar107._20_4_ = 0x3f800000;
                      auVar107._24_4_ = 0x3f800000;
                      auVar107._28_4_ = 0x3f800000;
                      auVar64 = vfnmadd213ps_fma(local_2660,auVar66,auVar107);
                      auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar66,auVar66);
                      fVar76 = auVar64._0_4_;
                      fVar81 = auVar64._4_4_;
                      local_25c0._4_4_ = fVar81 * local_2680._4_4_;
                      local_25c0._0_4_ = fVar76 * local_2680._0_4_;
                      fVar82 = auVar64._8_4_;
                      local_25c0._8_4_ = fVar82 * local_2680._8_4_;
                      fVar83 = auVar64._12_4_;
                      local_25c0._12_4_ = fVar83 * local_2680._12_4_;
                      local_25c0._16_4_ = fVar120 * 0.0;
                      local_25c0._20_4_ = fVar121 * 0.0;
                      local_25c0._24_4_ = fVar122 * 0.0;
                      local_25c0._28_4_ = 0x3f800000;
                      auVar106 = ZEXT3264(local_25c0);
                      local_2600[0] = (float)local_26c0._0_4_ * fVar76;
                      local_2600[1] = (float)local_26c0._4_4_ * fVar81;
                      local_2600[2] = fStack_26b8 * fVar82;
                      local_2600[3] = fStack_26b4 * fVar83;
                      fStack_25f0 = fStack_26b0 * 0.0;
                      fStack_25ec = fStack_26ac * 0.0;
                      fStack_25e8 = fStack_26a8 * 0.0;
                      fStack_25e4 = fStack_26a4;
                      local_25e0[0] = fVar86 * fVar76;
                      local_25e0[1] = fVar94 * fVar81;
                      local_25e0[2] = fVar95 * fVar82;
                      local_25e0[3] = fVar96 * fVar83;
                      fStack_25d0 = fVar97 * 0.0;
                      fStack_25cc = fVar98 * 0.0;
                      fStack_25c8 = fVar99 * 0.0;
                      fStack_25c4 = fStack_26a4;
                      auVar74._8_4_ = 0x7f800000;
                      auVar74._0_8_ = 0x7f8000007f800000;
                      auVar74._12_4_ = 0x7f800000;
                      auVar74._16_4_ = 0x7f800000;
                      auVar74._20_4_ = 0x7f800000;
                      auVar74._24_4_ = 0x7f800000;
                      auVar74._28_4_ = 0x7f800000;
                      auVar66 = vblendvps_avx(auVar74,local_25c0,local_2620);
                      auVar78 = vshufps_avx(auVar66,auVar66,0xb1);
                      auVar78 = vminps_avx(auVar66,auVar78);
                      auVar23 = vshufpd_avx(auVar78,auVar78,5);
                      auVar78 = vminps_avx(auVar78,auVar23);
                      auVar23 = vpermpd_avx2(auVar78,0x4e);
                      auVar78 = vminps_avx(auVar78,auVar23);
                      auVar78 = vcmpps_avx(auVar66,auVar78,0);
                      auVar23 = local_2620 & auVar78;
                      auVar66 = local_2620;
                      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar23 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar23 >> 0x7f,0) != '\0') ||
                            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar23 >> 0xbf,0) != '\0') ||
                          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar23[0x1f] < '\0') {
                        auVar66 = vandps_avx(auVar78,local_2620);
                      }
                      uVar58 = vmovmskps_avx(auVar66);
                      uVar116 = 0;
                      for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x80000000) {
                        uVar116 = uVar116 + 1;
                      }
                      uVar55 = (ulong)uVar116;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        fVar76 = local_2600[uVar55];
                        fVar86 = local_25e0[uVar55];
                        uVar48 = *(undefined4 *)(local_25a0 + uVar55 * 4);
                        uVar1 = *(undefined4 *)(local_2580 + uVar55 * 4);
                        uVar2 = *(undefined4 *)(local_2560 + uVar55 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_25c0 + uVar55 * 4);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar48;
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar2;
                        *(float *)(ray + k * 4 + 0xf0) = fVar76;
                        *(float *)(ray + k * 4 + 0x100) = fVar86;
                        *(uint *)(ray + k * 4 + 0x110) = uVar14;
                        *(uint *)(ray + k * 4 + 0x120) = uVar13;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_2870 = CONCAT44(uVar14,uVar14);
                        uVar43 = *local_2840;
                        uVar44 = local_2840[1];
                        local_2540 = local_25c0;
                        local_26e0 = local_2620;
                        do {
                          uVar48 = *(undefined4 *)(ray + k * 4 + 0x80);
                          fVar76 = local_2600[uVar55];
                          auVar69._4_4_ = fVar76;
                          auVar69._0_4_ = fVar76;
                          auVar69._8_4_ = fVar76;
                          auVar69._12_4_ = fVar76;
                          local_2470 = local_25e0[uVar55];
                          *(undefined4 *)(ray + k * 4 + 0x80) =
                               *(undefined4 *)(local_25c0 + uVar55 * 4);
                          local_27b0.context = context->user;
                          uVar1 = *(undefined4 *)(local_25a0 + uVar55 * 4);
                          uVar2 = *(undefined4 *)(local_2580 + uVar55 * 4);
                          auVar87._4_4_ = uVar2;
                          auVar87._0_4_ = uVar2;
                          auVar87._8_4_ = uVar2;
                          auVar87._12_4_ = uVar2;
                          uVar2 = *(undefined4 *)(local_2560 + uVar55 * 4);
                          local_2490._4_4_ = uVar2;
                          local_2490._0_4_ = uVar2;
                          local_2490._8_4_ = uVar2;
                          local_2490._12_4_ = uVar2;
                          local_24b0[0] = (RTCHitN)(char)uVar1;
                          local_24b0[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                          local_24b0[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                          local_24b0[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                          local_24b0[4] = (RTCHitN)(char)uVar1;
                          local_24b0[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                          local_24b0[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                          local_24b0[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                          local_24b0[8] = (RTCHitN)(char)uVar1;
                          local_24b0[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                          local_24b0[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                          local_24b0[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                          local_24b0[0xc] = (RTCHitN)(char)uVar1;
                          local_24b0[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                          local_24b0[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                          local_24b0[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                          local_24a0 = auVar87;
                          local_2480 = auVar69;
                          fStack_246c = local_2470;
                          fStack_2468 = local_2470;
                          fStack_2464 = local_2470;
                          local_2460 = local_2870;
                          uStack_2458 = CONCAT44(uVar14,uVar14);
                          local_2450._4_4_ = uVar13;
                          local_2450._0_4_ = uVar13;
                          local_2450._8_4_ = uVar13;
                          local_2450._12_4_ = uVar13;
                          vpcmpeqd_avx2(ZEXT1632(local_2450),ZEXT1632(local_2450));
                          uStack_243c = (local_27b0.context)->instID[0];
                          local_2440 = uStack_243c;
                          uStack_2438 = uStack_243c;
                          uStack_2434 = uStack_243c;
                          uStack_2430 = (local_27b0.context)->instPrimID[0];
                          uStack_242c = uStack_2430;
                          uStack_2428 = uStack_2430;
                          uStack_2424 = uStack_2430;
                          local_27b0.valid = (int *)&local_2850;
                          local_27b0.geometryUserPtr = pGVar15->userPtr;
                          local_27b0.hit = local_24b0;
                          local_27b0.N = 4;
                          local_2850 = uVar43;
                          uStack_2848 = uVar44;
                          local_27b0.ray = (RTCRayN *)ray;
                          if (pGVar15->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar15->intersectionFilterN)(&local_27b0);
                            auVar106._8_56_ = extraout_var;
                            auVar106._0_8_ = extraout_XMM1_Qa;
                            auVar69 = auVar106._0_16_;
                            auVar106 = ZEXT3264(local_2540);
                          }
                          auVar45._8_8_ = uStack_2848;
                          auVar45._0_8_ = local_2850;
                          if (auVar45 == (undefined1  [16])0x0) {
                            auVar64 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                            auVar68 = vpcmpeqd_avx(auVar69,auVar69);
                            auVar64 = auVar64 ^ auVar68;
                          }
                          else {
                            p_Var16 = context->args->filter;
                            if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var16)(&local_27b0);
                              auVar106 = ZEXT3264(local_2540);
                            }
                            auVar46._8_8_ = uStack_2848;
                            auVar46._0_8_ = local_2850;
                            auVar68 = vpcmpeqd_avx(auVar46,_DAT_01feba10);
                            auVar77 = vpcmpeqd_avx(auVar87,auVar87);
                            auVar64 = auVar68 ^ auVar77;
                            if (auVar46 != (undefined1  [16])0x0) {
                              auVar68 = auVar68 ^ auVar77;
                              auVar77 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])local_27b0.hit)
                              ;
                              *(undefined1 (*) [16])(local_27b0.ray + 0xc0) = auVar77;
                              auVar77 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])
                                                                (local_27b0.hit + 0x10));
                              *(undefined1 (*) [16])(local_27b0.ray + 0xd0) = auVar77;
                              auVar77 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])
                                                                (local_27b0.hit + 0x20));
                              *(undefined1 (*) [16])(local_27b0.ray + 0xe0) = auVar77;
                              auVar77 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])
                                                                (local_27b0.hit + 0x30));
                              *(undefined1 (*) [16])(local_27b0.ray + 0xf0) = auVar77;
                              auVar77 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])
                                                                (local_27b0.hit + 0x40));
                              *(undefined1 (*) [16])(local_27b0.ray + 0x100) = auVar77;
                              auVar77 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])
                                                                (local_27b0.hit + 0x50));
                              *(undefined1 (*) [16])(local_27b0.ray + 0x110) = auVar77;
                              auVar77 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])
                                                                (local_27b0.hit + 0x60));
                              *(undefined1 (*) [16])(local_27b0.ray + 0x120) = auVar77;
                              auVar77 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])
                                                                (local_27b0.hit + 0x70));
                              *(undefined1 (*) [16])(local_27b0.ray + 0x130) = auVar77;
                              auVar68 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])
                                                                (local_27b0.hit + 0x80));
                              *(undefined1 (*) [16])(local_27b0.ray + 0x140) = auVar68;
                            }
                          }
                          auVar70._8_8_ = 0x100000001;
                          auVar70._0_8_ = 0x100000001;
                          if ((auVar70 & auVar64) == (undefined1  [16])0x0) {
                            *(undefined4 *)(ray + k * 4 + 0x80) = uVar48;
                          }
                          *(undefined4 *)(local_26e0 + uVar55 * 4) = 0;
                          uVar48 = *(undefined4 *)(ray + k * 4 + 0x80);
                          auVar67._4_4_ = uVar48;
                          auVar67._0_4_ = uVar48;
                          auVar67._8_4_ = uVar48;
                          auVar67._12_4_ = uVar48;
                          auVar67._16_4_ = uVar48;
                          auVar67._20_4_ = uVar48;
                          auVar67._24_4_ = uVar48;
                          auVar67._28_4_ = uVar48;
                          auVar78 = vcmpps_avx(auVar106._0_32_,auVar67,2);
                          auVar66 = vandps_avx(auVar78,local_26e0);
                          local_26e0 = local_26e0 & auVar78;
                          bVar41 = (local_26e0 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar42 = (local_26e0 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar40 = (local_26e0 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar39 = SUB321(local_26e0 >> 0x7f,0) != '\0';
                          bVar38 = (local_26e0 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar37 = SUB321(local_26e0 >> 0xbf,0) != '\0';
                          bVar36 = (local_26e0 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar35 = local_26e0[0x1f] < '\0';
                          if (((((((bVar41 || bVar42) || bVar40) || bVar39) || bVar38) || bVar37) ||
                              bVar36) || bVar35) {
                            auVar75._8_4_ = 0x7f800000;
                            auVar75._0_8_ = 0x7f8000007f800000;
                            auVar75._12_4_ = 0x7f800000;
                            auVar75._16_4_ = 0x7f800000;
                            auVar75._20_4_ = 0x7f800000;
                            auVar75._24_4_ = 0x7f800000;
                            auVar75._28_4_ = 0x7f800000;
                            auVar78 = vblendvps_avx(auVar75,auVar106._0_32_,auVar66);
                            auVar23 = vshufps_avx(auVar78,auVar78,0xb1);
                            auVar23 = vminps_avx(auVar78,auVar23);
                            auVar17 = vshufpd_avx(auVar23,auVar23,5);
                            auVar23 = vminps_avx(auVar23,auVar17);
                            auVar17 = vpermpd_avx2(auVar23,0x4e);
                            auVar23 = vminps_avx(auVar23,auVar17);
                            auVar23 = vcmpps_avx(auVar78,auVar23,0);
                            auVar17 = auVar66 & auVar23;
                            auVar78 = auVar66;
                            if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar17 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar17 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar17 >> 0x7f,0) != '\0') ||
                                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                                  ) || SUB321(auVar17 >> 0xbf,0) != '\0') ||
                                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar17[0x1f] < '\0') {
                              auVar78 = vandps_avx(auVar23,auVar66);
                            }
                            uVar58 = vmovmskps_avx(auVar78);
                            uVar116 = 0;
                            for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x80000000) {
                              uVar116 = uVar116 + 1;
                            }
                            uVar55 = (ulong)uVar116;
                          }
                          local_26e0 = auVar66;
                        } while (((((((bVar41 || bVar42) || bVar40) || bVar39) || bVar38) || bVar37)
                                 || bVar36) || bVar35);
                      }
                    }
                  }
                }
              }
              local_27b8 = local_27b8 - 1 & local_27b8;
            } while (local_27b8 != 0);
          }
          local_27c8 = local_27c8 + 1;
        } while (local_27c8 != local_2800);
      }
      iStack_26e4 = *(int *)(ray + k * 4 + 0x80);
      auVar108 = ZEXT3264(local_2720);
      auVar109 = ZEXT3264(local_2740);
      auVar111 = ZEXT3264(local_2760);
      auVar106 = ZEXT3264(local_2780);
      iStack_26e8 = iStack_26e4;
      iStack_26ec = iStack_26e4;
      iStack_26f0 = iStack_26e4;
      iStack_26f4 = iStack_26e4;
      iStack_26f8 = iStack_26e4;
      iStack_26fc = iStack_26e4;
      local_2700 = iStack_26e4;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }